

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse4.c
# Opt level: O0

uint32_t aom_highbd_12_sub_pixel_variance4x4_sse4_1
                   (uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int dst_stride,
                   uint32_t *sse)

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  uint32_t *in_stack_00000008;
  uint16_t temp2 [16];
  uint16_t fdata3 [20];
  uint16_t local_78 [16];
  uint16_t local_58 [26];
  int local_24;
  uint8_t *local_20;
  int local_14;
  
  local_24 = in_R9D;
  local_20 = in_R8;
  local_14 = in_ECX;
  aom_highbd_var_filter_block2d_bil_first_pass
            (in_RDI,local_58,in_ESI,1,5,4,bilinear_filters_2t[in_EDX]);
  aom_highbd_var_filter_block2d_bil_second_pass
            (local_58,local_78,4,4,4,4,bilinear_filters_2t[local_14]);
  uVar1 = (*aom_highbd_12_variance4x4)
                    ((uint8_t *)((ulong)local_78 >> 1),4,local_20,local_24,in_stack_00000008);
  return uVar1;
}

Assistant:

uint32_t aom_highbd_12_sub_pixel_variance4x4_sse4_1(
    const uint8_t *src, int src_stride, int xoffset, int yoffset,
    const uint8_t *dst, int dst_stride, uint32_t *sse) {
  uint16_t fdata3[(4 + 1) * 4];
  uint16_t temp2[4 * 4];

  aom_highbd_var_filter_block2d_bil_first_pass(
      src, fdata3, src_stride, 1, 4 + 1, 4, bilinear_filters_2t[xoffset]);
  aom_highbd_var_filter_block2d_bil_second_pass(fdata3, temp2, 4, 4, 4, 4,
                                                bilinear_filters_2t[yoffset]);

  return aom_highbd_12_variance4x4(CONVERT_TO_BYTEPTR(temp2), 4, dst,
                                   dst_stride, sse);
}